

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

void deBsdAddressToSocketAddress(deSocketAddress *address,sockaddr *bsdAddr,int addrLen)

{
  deUint16 dVar1;
  char local_68 [8];
  char buf_1 [40];
  sockaddr_in6 *addr6;
  char buf [16];
  sockaddr_in *addr4;
  int addrLen_local;
  sockaddr *bsdAddr_local;
  deSocketAddress *address_local;
  
  if (bsdAddr->sa_family == 2) {
    buf._8_8_ = bsdAddr;
    deSocketAddress_setFamily(address,DE_SOCKETFAMILY_INET4);
    dVar1 = deNetworkToHostOrder16(*(deUint16 *)(buf._8_8_ + 2));
    deSocketAddress_setPort(address,(uint)dVar1);
    inet_ntop(2,(void *)(buf._8_8_ + 4),(char *)&addr6,0x10);
    deSocketAddress_setHost(address,(char *)&addr6);
  }
  else if (bsdAddr->sa_family == 10) {
    buf_1._32_8_ = bsdAddr;
    deSocketAddress_setFamily(address,DE_SOCKETFAMILY_INET6);
    dVar1 = deNetworkToHostOrder16(*(deUint16 *)(buf_1._32_8_ + 2));
    deSocketAddress_setPort(address,(uint)dVar1);
    inet_ntop(10,(void *)(buf_1._32_8_ + 8),local_68,0x28);
    deSocketAddress_setHost(address,local_68);
  }
  return;
}

Assistant:

void deBsdAddressToSocketAddress (deSocketAddress* address, const struct sockaddr* bsdAddr, int addrLen)
{
	/* Decode client address info. */
	if (bsdAddr->sa_family == AF_INET)
	{
		const struct sockaddr_in* addr4 = (const struct sockaddr_in*)bsdAddr;
		DE_ASSERT(addrLen >= (int)sizeof(struct sockaddr_in));
		DE_UNREF(addrLen);

		deSocketAddress_setFamily(address, DE_SOCKETFAMILY_INET4);
		deSocketAddress_setPort(address, (int)deNetworkToHostOrder16((deUint16)addr4->sin_port));

		{
			char buf[16]; /* Max valid address takes 3*4 + 3 = 15 chars */
			inet_ntop(AF_INET, (void*)&addr4->sin_addr, buf, sizeof(buf));
			deSocketAddress_setHost(address, buf);
		}
	}
	else if (bsdAddr->sa_family == AF_INET6)
	{
		const struct sockaddr_in6* addr6 = (const struct sockaddr_in6*)bsdAddr;
		DE_ASSERT(addrLen >= (int)sizeof(struct sockaddr_in6));
		DE_UNREF(addrLen);

		deSocketAddress_setFamily(address, DE_SOCKETFAMILY_INET6);
		deSocketAddress_setPort(address, (int)deNetworkToHostOrder16((deUint16)addr6->sin6_port));

		{
			char buf[40]; /* Max valid address takes 8*4 + 7 = 39 chars */
			inet_ntop(AF_INET6, (void*)&addr6->sin6_addr, buf, sizeof(buf));
			deSocketAddress_setHost(address, buf);
		}
	}
	else
		DE_ASSERT(DE_FALSE);
}